

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_module(lua_State *L)

{
  TValue *pTVar1;
  TValue *pTVar2;
  int iVar3;
  char *modname_00;
  int lastarg;
  char *modname;
  lua_State *L_local;
  
  modname_00 = luaL_checklstring(L,1,(size_t *)0x0);
  pTVar1 = L->top;
  pTVar2 = L->base;
  luaL_pushmodule(L,modname_00,1);
  lua_getfield(L,-1,"_NAME");
  iVar3 = lua_type(L,-1);
  if (iVar3 == 0) {
    lua_settop(L,-2);
    modinit(L,modname_00);
  }
  else {
    lua_settop(L,-2);
  }
  lua_pushvalue(L,-1);
  setfenv(L);
  dooptions(L,(int)((long)pTVar1 - (long)pTVar2 >> 3));
  return 0;
}

Assistant:

static int lj_cf_package_module(lua_State *L)
{
  const char *modname = luaL_checkstring(L, 1);
  int lastarg = (int)(L->top - L->base);
  luaL_pushmodule(L, modname, 1);
  lua_getfield(L, -1, "_NAME");
  if (!lua_isnil(L, -1)) {  /* Module already initialized? */
    lua_pop(L, 1);
  } else {
    lua_pop(L, 1);
    modinit(L, modname);
  }
  lua_pushvalue(L, -1);
  setfenv(L);
  dooptions(L, lastarg);
  return LJ_52;
}